

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.c
# Opt level: O0

int filter_register(kqueue *kq,filter *src)

{
  int iVar1;
  undefined2 *__dest;
  short *in_RSI;
  long in_RDI;
  int rv;
  uint filt;
  filter *dst;
  int local_4;
  
  if (*in_RSI == 0) {
    local_4 = 0;
  }
  else if (0xffffffffU - (int)*in_RSI < 0xc) {
    __dest = (undefined2 *)(in_RDI + 0x18 + (ulong)(0xffffffffU - (int)*in_RSI) * 0xa0);
    memcpy(__dest,in_RSI,0xa0);
    *(long *)(__dest + 0x4c) = in_RDI;
    *(undefined8 *)(__dest + 0x34) = 0;
    if (*in_RSI == 0) {
      local_4 = 0;
    }
    else if ((*(long *)(in_RSI + 0x10) == 0) ||
            (iVar1 = (**(code **)(in_RSI + 0x10))(__dest), -1 < iVar1)) {
      local_4 = 0;
    }
    else {
      *__dest = 0;
      local_4 = -1;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int
filter_register(struct kqueue *kq, const struct filter *src)
{
    struct filter *dst;
    unsigned int filt;
    int rv = 0;

    /*
     * This filter is not implemented, see EVFILT_NOTIMPL.
     */
    if (src->kf_id == 0) return (0);

    filt = (-1 * src->kf_id) - 1; /* flip sign, and convert to array offset */
    if (filt >= EVFILT_SYSCOUNT)
        return (-1);

    dst = &kq->kq_filt[filt];
    memcpy(dst, src, sizeof(*src));
    dst->kf_kqueue = kq;
    RB_INIT(&dst->kf_index);

    if (src->kf_id == 0) {
        dbg_puts("filter is not implemented");
        return (0);
    }

    assert(src->kf_copyout);
    assert(src->kn_create);
    assert(src->kn_modify);
    assert(src->kn_delete);
    assert(src->kn_enable);
    assert(src->kn_disable);

    /* Perform (optional) per-filter initialization */
    if (src->kf_init != NULL) {
        rv = src->kf_init(dst);
        if (rv < 0) {
            dbg_puts("filter failed to initialize");
            dst->kf_id = 0;
            return (-1);
        }
    }

    /* FIXME: should totally remove const from src */
    if ((kqops.filter_init != NULL) && (kqops.filter_init(kq, dst) < 0))
        return (-1);

    return (0);
}